

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

int CmpLookup(void *p,void *va,void *vb)

{
  char *pcVar1;
  
  if (*vb < *va) {
    return 1;
  }
  if (*va < *vb) {
    return -1;
  }
  pcVar1 = *(char **)((long)vb + 8);
  if (*(char **)((long)va + 8) == (char *)0x0) {
    if (pcVar1 == (char *)0x0) goto LAB_0011f18e;
  }
  else {
    if (pcVar1 == (char *)0x0) goto LAB_0011f18e;
    if (**(char **)((long)va + 8) == '&') {
      return 1;
    }
  }
  if (*pcVar1 == '&') {
    return -1;
  }
LAB_0011f18e:
  if (va == p) {
    return 1;
  }
  return -(uint)(vb == p);
}

Assistant:

static NOINLINE int CmpLookup(const void* p, const void* va, const void* vb)
{
    const nodemetalookup* a = va;
    const nodemetalookup* b = vb;
    // sort by Id
    if (a->Id > b->Id) return 1;
    if (a->Id < b->Id) return -1;
    // make sure META_PARAM_BIT is after META_MODE_DATA
    if (a->Meta && b->Meta && a->Meta->Meta == META_PARAM_BIT) return 1;
    if (b->Meta && b->Meta && b->Meta->Meta == META_PARAM_BIT) return -1;
    // make sure META_PARAM_EVENT's are added in the order as they are found
    if (a==p) return 1;
    if (b==p) return -1;
    return 0;
}